

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# p_acs.cpp
# Opt level: O3

int __thiscall ACSStringPool::InsertString(ACSStringPool *this,FString *str,uint h,uint bucketnum)

{
  uint uVar1;
  PoolEntry *pPVar2;
  uint uVar3;
  uint uVar4;
  uint *puVar5;
  uint uVar6;
  
  uVar6 = this->FirstFreeEntry;
  if (99 < uVar6) {
    if (uVar6 == (this->Pool).Most) {
      P_CollectACSGlobalStrings();
      uVar6 = this->FirstFreeEntry;
    }
    if (0x7fefffff < uVar6) {
      return -1;
    }
  }
  uVar1 = (this->Pool).Count;
  if (uVar6 == uVar1) {
    TArray<ACSStringPool::PoolEntry,_ACSStringPool::PoolEntry>::Reserve(&this->Pool,1);
    pPVar2 = (this->Pool).Array;
    uVar4 = this->FirstFreeEntry + 1;
  }
  else {
    uVar3 = uVar6 + 1;
    pPVar2 = (this->Pool).Array;
    uVar4 = uVar3;
    if (uVar3 < uVar1) {
      puVar5 = &pPVar2[(ulong)uVar6 + 1].Next;
      do {
        uVar4 = uVar3;
        if (*puVar5 == 0xfffffffe) break;
        uVar3 = uVar3 + 1;
        puVar5 = puVar5 + 6;
        uVar4 = uVar1;
      } while (uVar1 != uVar3);
    }
  }
  this->FirstFreeEntry = uVar4;
  pPVar2 = pPVar2 + uVar6;
  FString::operator=(&pPVar2->Str,str);
  pPVar2->Hash = h;
  pPVar2->Next = this->PoolBuckets[bucketnum];
  pPVar2->LockCount = 0;
  this->PoolBuckets[bucketnum] = uVar6;
  return uVar6 | 0x7ff00000;
}

Assistant:

int ACSStringPool::InsertString(FString &str, unsigned int h, unsigned int bucketnum)
{
	unsigned int index = FirstFreeEntry;
	if (index >= MIN_GC_SIZE && index == Pool.Max())
	{ // We will need to grow the array. Try a garbage collection first.
		P_CollectACSGlobalStrings();
		index = FirstFreeEntry;
	}
	if (FirstFreeEntry >= STRPOOL_LIBRARYID_OR)
	{ // If we go any higher, we'll collide with the library ID marker.
		return -1;
	}
	if (index == Pool.Size())
	{ // There were no free entries; make a new one.
		Pool.Reserve(1);
		FirstFreeEntry++;
	}
	else
	{ // Scan for the next free entry
		FindFirstFreeEntry(FirstFreeEntry + 1);
	}
	PoolEntry *entry = &Pool[index];
	entry->Str = str;
	entry->Hash = h;
	entry->Next = PoolBuckets[bucketnum];
	entry->LockCount = 0;
	PoolBuckets[bucketnum] = index;
	return index | STRPOOL_LIBRARYID_OR;
}